

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamState.cpp
# Opt level: O1

void __thiscall
TasDREAM::TasmanianDREAM::getApproximateMode
          (TasmanianDREAM *this,vector<double,_std::allocator<double>_> *mode)

{
  double *pdVar1;
  size_t sVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  
  pdVar5 = (this->pdf_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar1 = (this->pdf_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar4 = pdVar5 + 1;
  if (pdVar4 != pdVar1 && pdVar5 != pdVar1) {
    do {
      pdVar3 = pdVar4;
      if (*pdVar4 < *pdVar5 || *pdVar4 == *pdVar5) {
        pdVar3 = pdVar5;
      }
      pdVar5 = pdVar3;
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != pdVar1);
  }
  std::vector<double,_std::allocator<double>_>::resize(mode,this->num_dimensions);
  sVar2 = this->num_dimensions;
  if (sVar2 == 0) {
    return;
  }
  memmove((mode->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start,
          (this->history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start +
          ((ulong)((long)pdVar5 -
                  (long)(this->pdf_history).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start) >> 3) * sVar2,sVar2 << 3);
  return;
}

Assistant:

void TasmanianDREAM::getApproximateMode(std::vector<double> &mode) const{
    auto imax = std::max_element(pdf_history.begin(), pdf_history.end());
    mode.resize(num_dimensions);
    std::copy_n(history.begin() + std::distance(pdf_history.begin(), imax) * num_dimensions, num_dimensions, mode.data());
}